

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt_wallet_tests.cpp
# Opt level: O3

void __thiscall wallet::psbt_wallet_tests::parse_hd_keypath::test_method(parse_hd_keypath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keypath;
  check_type cVar5;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char **local_b8;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x57;
  file.m_begin = (iterator)&local_88;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_f0,0x57);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_00000058;
  file_00.m_begin = (iterator)&local_100;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"///////////////////////////","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"///////////////////////////\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_118 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_120,0x58);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5a;
  file_01.m_begin = (iterator)&local_130;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_140,
             msg_01);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/1","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/1\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_148 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_150,0x5a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5b;
  file_02.m_begin = (iterator)&local_160;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_170,
             msg_02);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"//////////////////////////\'/","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"//////////////////////////\'/\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_178 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_180,0x5b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5d;
  file_03.m_begin = (iterator)&local_190;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a0,
             msg_03);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_1b0,0x5d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5e;
  file_04.m_begin = (iterator)&local_1c0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d0,
             msg_04);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1///////////////////////////","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"1///////////////////////////\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_1e0,0x5e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x60;
  file_05.m_begin = (iterator)&local_1f0;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_200,
             msg_05);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1\'/\", keypath)"
  ;
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_208 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_210,0x60);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x61;
  file_06.m_begin = (iterator)&local_220;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_230,
             msg_06);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"1/\'//////////////////////////","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"1/\'//////////////////////////\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_238 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_240,0x61);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x63;
  file_07.m_begin = (iterator)&local_250;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_260,
             msg_07);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_268 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_270,99);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x64;
  file_08.m_begin = (iterator)&local_280;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_290,
             msg_08);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," ","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\" \", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_298 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_2a0,100);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x66;
  file_09.m_begin = (iterator)&local_2b0;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2c0,
             msg_09);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"0","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_2d0,0x66);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x67;
  file_10.m_begin = (iterator)&local_2e0;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2f0,
             msg_10);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"O","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"O\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_2f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_300,0x67);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x69;
  file_11.m_begin = (iterator)&local_310;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_320,
             msg_11);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"0000\'/0000\'/0000\'","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"0000\'/0000\'/0000\'\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_328 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_330,0x69);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x6a;
  file_12.m_begin = (iterator)&local_340;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_350,
             msg_12);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"0000,/0000,/0000,","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"0000,/0000,/0000,\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_358 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_360,0x6a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x6c;
  file_13.m_begin = (iterator)&local_370;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_380,
             msg_13);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"01234","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"01234\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_388 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_390,0x6c);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x6d;
  file_14.m_begin = (iterator)&local_3a0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3b0,
             msg_14);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"0x1234","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"0x1234\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_3c0,0x6d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x6f;
  file_15.m_begin = (iterator)&local_3d0;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3e0,
             msg_15);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"1","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"1\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_3f0,0x6f);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x70;
  file_16.m_begin = (iterator)&local_400;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_410,
             msg_16);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58," 1","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\" 1\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_418 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_420,0x70);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x72;
  file_17.m_begin = (iterator)&local_430;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_440,
             msg_17);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"42","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"42\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_448 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_450,0x72);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x73;
  file_18.m_begin = (iterator)&local_460;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_470,
             msg_18);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m42","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m42\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_478 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_480,0x73);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = &DAT_00000075;
  file_19.m_begin = (iterator)&local_490;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4a0,
             msg_19);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"4294967295","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"4294967295\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_4b0,0x75);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x76;
  file_20.m_begin = (iterator)&local_4c0;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4d0,
             msg_20);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"4294967296","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"4294967296\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_4e0,0x76);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x78;
  file_21.m_begin = (iterator)&local_4f0;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_500,
             msg_21);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_508 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_510,0x78);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x79;
  file_22.m_begin = (iterator)&local_520;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_530,
             msg_22);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"n\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_538 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_540,0x79);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x7b;
  file_23.m_begin = (iterator)&local_550;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_560,
             msg_23);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_568 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_570,0x7b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x7c;
  file_24.m_begin = (iterator)&local_580;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_590,
             msg_24);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n/","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"n/\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_598 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_5a0,0x7c);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x7e;
  file_25.m_begin = (iterator)&local_5b0;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_5c0,
             msg_25);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_5d0,0x7e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x7f;
  file_26.m_begin = (iterator)&local_5e0;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5f0,
             msg_26);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n/0","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"n/0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_5f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_600,0x7f);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x81;
  file_27.m_begin = (iterator)&local_610;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_620,
             msg_27);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0\'","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0\'\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_628 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_630,0x81);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x82;
  file_28.m_begin = (iterator)&local_640;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_650,
             msg_28);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0\'\'","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/0\'\'\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_658 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_660,0x82);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x84;
  file_29.m_begin = (iterator)&local_670;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_680,
             msg_29);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0\'/0\'","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0\'/0\'\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_690 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_688 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_690,0x84);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x85;
  file_30.m_begin = (iterator)&local_6a0;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_6b0,
             msg_30);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/\'0/0\'","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/\'0/0\'\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_6c0,0x85);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x87;
  file_31.m_begin = (iterator)&local_6d0;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6e0,
             msg_31);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/0","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0/0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_6f0,0x87);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x88;
  file_32.m_begin = (iterator)&local_700;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_710,
             msg_32);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"n/0/0","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"n/0/0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_718 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_720,0x88);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x8a;
  file_33.m_begin = (iterator)&local_730;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_740,
             msg_33);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/0/00","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0/0/00\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_750 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_748 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_750,0x8a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x8b;
  file_34.m_begin = (iterator)&local_760;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_770,
             msg_34);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/0/f00","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/0/0/f00\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_778 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_780,0x8b);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x8d;
  file_35.m_begin = (iterator)&local_790;
  msg_35.m_end = pvVar4;
  msg_35.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_7a0,
             msg_35);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,"");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "ParseHDKeypath(\"m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000\", keypath)"
  ;
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_7b0,0x8d);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x8e;
  file_36.m_begin = (iterator)&local_7c0;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7d0,
             msg_36);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111"
             ,"");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = 
  "!ParseHDKeypath(\"m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111\", keypath)"
  ;
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_7e0,0x8e);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x90;
  file_37.m_begin = (iterator)&local_7f0;
  msg_37.m_end = pvVar4;
  msg_37.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_800,
             msg_37);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/00/0","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0/00/0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_808 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_810,0x90);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x91;
  file_38.m_begin = (iterator)&local_820;
  msg_38.m_end = pvVar4;
  msg_38.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_830,
             msg_38);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0\'/00/\'0","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/0\'/00/\'0\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_840 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_838 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_840,0x91);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x93;
  file_39.m_begin = (iterator)&local_850;
  msg_39.m_end = pvVar4;
  msg_39.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_860,
             msg_39);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/1/","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/1/\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_870 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_868 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_870,0x93);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x94;
  file_40.m_begin = (iterator)&local_880;
  msg_40.m_end = pvVar4;
  msg_40.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_890,
             msg_40);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/1//","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/1//\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_8a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_898 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_8a0,0x94);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_8b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x96;
  file_41.m_begin = (iterator)&local_8b0;
  msg_41.m_end = pvVar4;
  msg_41.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8c0,
             msg_41);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/4294967295","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/0/4294967295\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_8d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_8d0,0x96);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x97;
  file_42.m_begin = (iterator)&local_8e0;
  msg_42.m_end = pvVar4;
  msg_42.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_8f0,
             msg_42);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/0/4294967296","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/0/4294967296\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_900 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_8f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_900,0x97);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x99;
  file_43.m_begin = (iterator)&local_910;
  msg_43.m_end = pvVar4;
  msg_43.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_920,
             msg_43);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/4294967295","");
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseHDKeypath(&local_58,&local_78);
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "ParseHDKeypath(\"m/4294967295\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_930 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_928 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,_cVar5,(size_t)&local_930,0x99);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/psbt_wallet_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x9a;
  file_44.m_begin = (iterator)&local_940;
  msg_44.m_end = pvVar4;
  msg_44.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_950,
             msg_44);
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"m/4294967296","");
  bVar2 = ParseHDKeypath(&local_58,&local_78);
  local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = "!ParseHDKeypath(\"m/4294967296\", keypath)";
  local_d8 = "";
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_d0,1,0,WARN,0xf897c2,(size_t)&stack0xfffffffffffff6a0,0x9a);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hd_keypath)
{
    std::vector<uint32_t> keypath;

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/1", keypath));
    BOOST_CHECK(!ParseHDKeypath("//////////////////////////'/", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1///////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1/1'/", keypath));
    BOOST_CHECK(!ParseHDKeypath("1/'//////////////////////////", keypath));

    BOOST_CHECK(ParseHDKeypath("", keypath));
    BOOST_CHECK(!ParseHDKeypath(" ", keypath));

    BOOST_CHECK(ParseHDKeypath("0", keypath));
    BOOST_CHECK(!ParseHDKeypath("O", keypath));

    BOOST_CHECK(ParseHDKeypath("0000'/0000'/0000'", keypath));
    BOOST_CHECK(!ParseHDKeypath("0000,/0000,/0000,", keypath));

    BOOST_CHECK(ParseHDKeypath("01234", keypath));
    BOOST_CHECK(!ParseHDKeypath("0x1234", keypath));

    BOOST_CHECK(ParseHDKeypath("1", keypath));
    BOOST_CHECK(!ParseHDKeypath(" 1", keypath));

    BOOST_CHECK(ParseHDKeypath("42", keypath));
    BOOST_CHECK(!ParseHDKeypath("m42", keypath));

    BOOST_CHECK(ParseHDKeypath("4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m", keypath));
    BOOST_CHECK(!ParseHDKeypath("n", keypath));

    BOOST_CHECK(ParseHDKeypath("m/", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0''", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0'/0'", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/'0/0'", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("n/0/0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/00", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0/0/f00", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/0/000000000000000000000000000000000000000000000000000000000000000000000000000000000000", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1/1/111111111111111111111111111111111111111111111111111111111111111111111111111111111111", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/00/0", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/0'/00/'0", keypath));

    BOOST_CHECK(ParseHDKeypath("m/1/", keypath));
    BOOST_CHECK(!ParseHDKeypath("m/1//", keypath));

    BOOST_CHECK(ParseHDKeypath("m/0/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/0/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1

    BOOST_CHECK(ParseHDKeypath("m/4294967295", keypath)); // 4294967295 == 0xFFFFFFFF (uint32_t max)
    BOOST_CHECK(!ParseHDKeypath("m/4294967296", keypath)); // 4294967296 == 0xFFFFFFFF (uint32_t max) + 1
}